

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_hpget(mcbsp_pid_t pid,void *src,mcbsp_size_t offset,void *dst,mcbsp_size_t size)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  mcbsp_pid_t mVar4;
  Memslot slot;
  Memblock *pMVar5;
  char *s;
  Memblock src_slot;
  Memslot src_slot_id;
  undefined1 local_50 [8];
  TicToc t;
  mcbsp_size_t size_local;
  void *dst_local;
  mcbsp_size_t offset_local;
  void *src_local;
  mcbsp_pid_t pid_local;
  
  t.m_nbytes = size;
  bsplib::TicToc::TicToc((TicToc *)local_50,HPGET,size);
  if ((s_spmd == (Spmd *)0x0) || (bVar2 = bsplib::Spmd::closed(s_spmd), bVar2)) {
    bsp_abort("bsp_hpget: can only be called within SPMD section\n");
  }
  if (t.m_nbytes != 0) {
    uVar3 = bsplib::Spmd::nprocs(s_spmd);
    if (uVar3 < pid) {
      bsp_abort("bsp_hpget: The source process ID does not exist\n");
    }
    if (src == (void *)0x0) {
      bsp_abort("bsp_hpget: Source address cannot be identified by NULL\n");
    }
    slot = lookup_usable_reg(src,"bsp_hpget");
    pMVar5 = bsplib::Rdma::slot(s_rdma,pid,slot);
    uVar1 = pMVar5->size;
    if (uVar1 < offset + t.m_nbytes) {
      bsp_abort("bsp_get: Reads %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                (offset + t.m_nbytes) - uVar1,pMVar5->addr,pMVar5->addr,uVar1,(ulong)pid);
    }
    mVar4 = bsplib::Spmd::pid(s_spmd);
    if (pid == mVar4) {
      memcpy(dst,(void *)((long)src + offset),t.m_nbytes);
    }
    else {
      bsplib::Rdma::hpget(s_rdma,pid,slot,offset,dst,t.m_nbytes);
    }
  }
  bsplib::TicToc::~TicToc((TicToc *)local_50);
  return;
}

Assistant:

void mcbsp_hpget( mcbsp_pid_t pid, const void * src, 
    mcbsp_size_t offset, const void * dst, mcbsp_size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPGET, size );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_hpget: can only be called within SPMD section\n");

    if (size == 0) // ignore any empty reads
        return;

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_hpget: The source process ID does not exist\n");

    if ( src == NULL )
        bsp_abort("bsp_hpget: Source address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot src_slot_id = lookup_usable_reg( src, "bsp_hpget" );
    bsplib::Rdma::Memblock src_slot = s_rdma->slot( pid, src_slot_id );

    if ( size_t(offset + size ) > src_slot.size )
        bsp_abort("bsp_get: Reads %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + size - src_slot.size,
                  src_slot.addr, src_slot.addr, src_slot.size, pid );

    if (pid == mcbsp_pid_t(s_spmd->pid()) )
    {
        const char * s = static_cast<const char *>(src);
        std::memcpy( const_cast<void *>(dst), s + offset, size );
    }
    else
    {
        s_rdma->hpget( pid, src_slot_id , offset, const_cast<void*>(dst), size );
    }
}